

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_str_insert_str_runes(nk_str *str,int pos,nk_rune *runes)

{
  int len;
  long lVar1;
  nk_glyph glyph;
  
  if (str != (nk_str *)0x0) {
    if (runes == (nk_rune *)0x0) {
      lVar1 = 0;
    }
    else {
      for (lVar1 = 0; runes[lVar1] != 0; lVar1 = lVar1 + 1) {
        len = nk_utf_encode(runes[lVar1],glyph,4);
        nk_str_insert_at_rune(str,(int)lVar1 + pos,glyph,len);
      }
    }
    return (int)lVar1;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x20e7,"int nk_str_insert_str_runes(struct nk_str *, int, const nk_rune *)");
}

Assistant:

NK_API int
nk_str_insert_str_runes(struct nk_str *str, int pos, const nk_rune *runes)
{
    int i = 0;
    nk_glyph glyph;
    int byte_len;
    NK_ASSERT(str);
    if (!str || !runes) return 0;
    while (runes[i] != '\0') {
        byte_len = nk_utf_encode(runes[i], glyph, NK_UTF_SIZE);
        nk_str_insert_at_rune(str, pos+i, glyph, byte_len);
        i++;
    }
    return i;
}